

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O2

void pbrt::ErrorExit<int&>(char *fmt,int *args)

{
  int *in_RCX;
  string local_28;
  
  StringPrintf<int&>(&local_28,(pbrt *)fmt,(char *)args,in_RCX);
  ErrorExit((FileLoc *)0x0,local_28._M_dataplus._M_p);
}

Assistant:

[[noreturn]] inline void ErrorExit(const char *fmt, Args &&... args) {
    ErrorExit(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}